

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristics.cpp
# Opt level: O3

void __thiscall Clasp::ClaspVmtf::setConfig(ClaspVmtf *this,HeuParams *params)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar1 = *(ushort *)params;
  uVar3 = 2;
  if (2 < uVar1) {
    uVar3 = (uint)uVar1;
  }
  uVar2 = 8;
  if (uVar1 != 0) {
    uVar2 = uVar3;
  }
  this->nMove_ = uVar2;
  uVar2 = *(ushort *)&params->field_0x2 & 3;
  this->scType_ = uVar2 + ((*(ushort *)&params->field_0x2 & 3) == 0);
  this->nant_ = (bool)((byte)(*(uint *)params >> 0x15) & 1);
  (this->types_).m = 0;
  uVar3 = *(uint *)params;
  uVar5 = uVar3 >> 0x12 & 3;
  uVar4 = 0;
  if (1 < uVar5) {
    uVar4 = (uint)(uVar5 == 3) * 8 + 4;
    (this->types_).m = uVar4;
    uVar3 = *(uint *)params;
  }
  if ((uVar3 & 0x100000) != 0 || uVar2 < 2) {
    uVar5 = (uVar3 & 0x100000) >> 0x14;
    uVar3 = uVar4 + 2 + uVar5;
    if (1 < uVar2) {
      uVar3 = uVar4 | uVar5;
    }
    (this->types_).m = uVar3;
  }
  return;
}

Assistant:

void ClaspVmtf::setConfig(const HeuParams& params) {
	nMove_  = params.param ? std::max(params.param, uint32(2)) : 8u;
	scType_ = params.score != HeuParams::score_auto ? params.score : static_cast<uint32>(HeuParams::score_min);
	nant_   = params.nant != 0;
	addOther(types_ = TypeSet(), params.other != HeuParams::other_auto ? params.other : static_cast<uint32>(HeuParams::other_no));
	if (params.moms) { types_.addSet(Constraint_t::Static); }
	if (scType_ == HeuParams::score_min) { types_.addSet(Constraint_t::Conflict); }
}